

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O3

int ompt_enumerate_mutex_impls(int current_impl,int *next_impl,char **next_impl_name)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(int *)((long)&kmp_mutex_impl_info[0].id + lVar1) == current_impl) {
      *next_impl = *(int *)((long)&kmp_mutex_impl_info[1].id + lVar1);
      *next_impl_name = *(char **)((long)&kmp_mutex_impl_info[1].name + lVar1);
      return 1;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x30);
  return 0;
}

Assistant:

OMPT_API_ROUTINE int ompt_enumerate_mutex_impls(int current_impl,
                                                int *next_impl,
                                                const char **next_impl_name) {
  const static int len =
      sizeof(kmp_mutex_impl_info) / sizeof(kmp_mutex_impl_info_t);
  int i = 0;
  for (i = 0; i < len - 1; i++) {
    if (kmp_mutex_impl_info[i].id != current_impl)
      continue;
    *next_impl = kmp_mutex_impl_info[i + 1].id;
    *next_impl_name = kmp_mutex_impl_info[i + 1].name;
    return 1;
  }
  return 0;
}